

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

bool doctest::anon_unknown_14::parseOptionImpl(int argc,char **argv,char *pattern,String *value)

{
  char cVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  String local_68;
  int local_4c;
  char *pcStack_48;
  uint len;
  char *curr;
  char *pcStack_38;
  bool noBadCharsFound;
  char *temp;
  int index;
  int i;
  String *value_local;
  char *pattern_local;
  char **argv_local;
  int argc_local;
  
  temp._4_4_ = argc;
  _index = value;
  value_local = (String *)pattern;
  pattern_local = (char *)argv;
  argv_local._0_4_ = argc;
  do {
    if (temp._4_4_ < 1) {
      return false;
    }
    temp._0_4_ = temp._4_4_ + -1;
    pcStack_38 = strstr(*(char **)(pattern_local + (long)(int)temp * 8),(char *)value_local);
    if (pcStack_38 != (char *)0x0) {
      if (_index == (String *)0x0) {
        sVar2 = strlen(pcStack_38);
        sVar3 = strlen((char *)value_local);
        if (sVar2 != sVar3) goto LAB_0010ea3b;
      }
      curr._7_1_ = '\x01';
      pcStack_48 = *(char **)(pattern_local + (long)(int)temp * 8);
      do {
        if (pcStack_48 == pcStack_38) goto LAB_0010e9a1;
        pcVar4 = pcStack_48 + 1;
        cVar1 = *pcStack_48;
        pcStack_48 = pcVar4;
      } while (cVar1 == '-');
      curr._7_1_ = '\0';
LAB_0010e9a1:
      if ((curr._7_1_ != '\0') && (**(char **)(pattern_local + (long)(int)temp * 8) == '-')) {
        if (_index == (String *)0x0) {
          return true;
        }
        sVar2 = strlen((char *)value_local);
        pcStack_38 = pcStack_38 + sVar2;
        sVar2 = strlen(pcStack_38);
        local_4c = (int)sVar2;
        if (local_4c != 0) {
          String::String(&local_68,pcStack_38);
          String::operator=(_index,&local_68);
          String::~String(&local_68);
          return true;
        }
        local_4c = 0;
      }
    }
LAB_0010ea3b:
    temp._4_4_ = temp._4_4_ + -1;
  } while( true );
}

Assistant:

bool parseOptionImpl(int argc, const char* const* argv, const char* pattern, String* value) {
        // going from the end to the beginning and stopping on the first occurrence from the end
        for(int i = argc; i > 0; --i) {
            auto index = i - 1;
            auto temp = std::strstr(argv[index], pattern);
            if(temp && (value || strlen(temp) == strlen(pattern))) { //!OCLINT prefer early exits and continue
                // eliminate matches in which the chars before the option are not '-'
                bool noBadCharsFound = true;
                auto curr            = argv[index];
                while(curr != temp) {
                    if(*curr++ != '-') {
                        noBadCharsFound = false;
                        break;
                    }
                }
                if(noBadCharsFound && argv[index][0] == '-') {
                    if(value) {
                        // parsing the value of an option
                        temp += strlen(pattern);
                        const unsigned len = strlen(temp);
                        if(len) {
                            *value = temp;
                            return true;
                        }
                    } else {
                        // just a flag - no value
                        return true;
                    }
                }
            }
        }
        return false;
    }